

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::GetPropertyWPCache<false,Js::JavascriptString*>
               (Var instance,RecyclableObject *propertyObject,JavascriptString *propertyKey,
               Var *value,ScriptContext *requestContext,PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  PropertyQueryFlags val;
  PropertyId PVar4;
  undefined4 *puVar5;
  PropertyRecordUsageCache *pPVar6;
  PropertyRecord *pPVar7;
  RecyclableObject *pRVar8;
  PropertyId propertyId;
  PropertyQueryFlags result;
  RecyclableObject *object;
  PropertyValueInfo *info_local;
  ScriptContext *requestContext_local;
  Var *value_local;
  JavascriptString *propertyKey_local;
  RecyclableObject *propertyObject_local;
  Var instance_local;
  
  _propertyId = propertyObject;
  if (value == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x7ff,"(value)","value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  while (BVar3 = IsNull(_propertyId), BVar3 == 0) {
    val = QueryGetOrHasProperty<false,Js::JavascriptString*>
                    (instance,_propertyId,propertyKey,value,info,requestContext);
    if (val != Property_NotFound) {
      bVar2 = VarIs<Js::UnscopablesWrapperObject,Js::RecyclableObject>(_propertyId);
      if ((!bVar2) &&
         (pPVar6 = PropertyValueInfo::GetPropertyRecordUsageCache(info),
         pPVar6 != (PropertyRecordUsageCache *)0x0)) {
        pPVar6 = PropertyValueInfo::GetPropertyRecordUsageCache(info);
        pPVar7 = PropertyRecordUsageCache::GetPropertyRecord(pPVar6);
        PVar4 = PropertyRecord::GetPropertyId(pPVar7);
        CacheOperators::CachePropertyRead
                  (instance,_propertyId,false,PVar4,false,info,requestContext);
      }
      BVar3 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
      return BVar3;
    }
    BVar3 = RecyclableObject::SkipsPrototype(_propertyId);
    if (BVar3 != 0) break;
    _propertyId = GetPrototypeNoTrap(_propertyId);
  }
  pPVar6 = PropertyValueInfo::GetPropertyRecordUsageCache(info);
  if (pPVar6 != (PropertyRecordUsageCache *)0x0) {
    pPVar6 = PropertyValueInfo::GetPropertyRecordUsageCache(info);
    pPVar7 = PropertyRecordUsageCache::GetPropertyRecord(pPVar6);
    PVar4 = PropertyRecord::GetPropertyId(pPVar7);
    TryCacheMissingProperty(instance,instance,false,PVar4,requestContext,info);
  }
  pRVar8 = ScriptContext::GetMissingPropertyResult(requestContext);
  *value = pRVar8;
  return 0;
}

Assistant:

BOOL JavascriptOperators::GetPropertyWPCache(Var instance, RecyclableObject* propertyObject, PropertyKeyType propertyKey, Var* value, ScriptContext* requestContext, _Inout_ PropertyValueInfo * info)
    {
        Assert(value);
        RecyclableObject* object = propertyObject;
        while (!JavascriptOperators::IsNull(object))
        {
            PropertyQueryFlags result = QueryGetOrHasProperty<OutputExistence>(instance, object, propertyKey, value, info, requestContext);

            if (result != PropertyQueryFlags::Property_NotFound)
            {
                if (!VarIs<UnscopablesWrapperObject>(object) && info->GetPropertyRecordUsageCache())
                {
                    PropertyId propertyId = info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId();
                    CacheOperators::CachePropertyRead(instance, object, false, propertyId, false, info, requestContext);
                }
                return JavascriptConversion::PropertyQueryFlagsToBoolean(result);
            }

            // SkipsPrototype refers only to the Get operation, not Has. Some objects like CustomExternalObject respond
            // to HasPropertyQuery with info only about the object itself and GetPropertyQuery with info about its prototype chain.
            // For consistency with the behavior of JavascriptOperators::HasProperty, don't skip prototypes when outputting existence.
            if (!OutputExistence && object->SkipsPrototype())
            {
                break;
            }
            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }
        if (info->GetPropertyRecordUsageCache())
        {
            TryCacheMissingProperty(instance, instance, false /*isRoot*/, info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId(), requestContext, info);
        }

        *value = OutputExistence
            ? requestContext->GetLibrary()->GetFalse()
            : requestContext->GetMissingPropertyResult();
        return FALSE;
    }